

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void row_numberValueFunc(sqlite3_context *pCtx)

{
  i64 *piVar1;
  i64 iVal;
  
  piVar1 = (i64 *)sqlite3_aggregate_context(pCtx,8);
  if (piVar1 == (i64 *)0x0) {
    iVal = 0;
  }
  else {
    iVal = *piVar1;
  }
  sqlite3_result_int64(pCtx,iVal);
  return;
}

Assistant:

static void row_numberValueFunc(sqlite3_context *pCtx){
  i64 *p = (i64*)sqlite3_aggregate_context(pCtx, sizeof(*p));
  sqlite3_result_int64(pCtx, (p ? *p : 0));
}